

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  double a;
  fpclass_type fVar1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  int *piVar6;
  pointer pnVar7;
  DataKey DVar8;
  undefined8 uVar9;
  int32_t iVar14;
  Item *pIVar10;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar11;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar12;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar15;
  int32_t iVar16;
  DataKey *pDVar17;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  undefined4 extraout_var;
  SPxOut *pSVar22;
  _func_int **pp_Var23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  long lVar25;
  long lVar26;
  undefined7 in_register_00000011;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  fpclass_type fVar28;
  ulong uVar29;
  ulong uVar30;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar31;
  pointer pUVar32;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar33;
  pointer pnVar34;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar35;
  cpp_dec_float<200U,_int,_void> *pcVar36;
  cpp_dec_float<200u,int,void> *pcVar37;
  uint *puVar38;
  undefined4 *puVar39;
  cpp_dec_float<200U,_int,_void> *pcVar40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar41;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar42;
  char cVar43;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar44;
  long in_FS_OFFSET;
  bool bVar45;
  byte bVar46;
  Real RVar47;
  Status enterStat;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f28;
  DataKey *local_f20;
  ulong local_f18;
  uint local_f0c;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f08;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  undefined1 local_bb8 [32];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [13];
  undefined3 uStack_b4b;
  int iStack_b48;
  bool bStack_b44;
  undefined8 local_b40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [13];
  undefined3 uStack_a4b;
  int iStack_a48;
  undefined1 uStack_a44;
  undefined8 local_a40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined5 uStack_850;
  undefined3 uStack_84b;
  int iStack_848;
  byte bStack_844;
  undefined8 local_840;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  uint local_5b0 [28];
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  uint local_4b0 [28];
  int local_440;
  undefined1 local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  uint local_430 [28];
  int local_3c0;
  undefined1 local_3bc;
  fpclass_type local_3b8;
  int32_t iStack_3b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0 [2];
  uint local_2b0 [28];
  int local_240;
  undefined1 local_23c;
  fpclass_type local_238;
  int32_t iStack_234;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  bVar46 = 0;
  local_f08 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_f08._4_4_,(int)CONCAT71(in_register_00000011,polish));
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 0x1c;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems[8] = 0;
  enterTest.m_backend.data._M_elems[9] = 0;
  enterTest.m_backend.data._M_elems[10] = 0;
  enterTest.m_backend.data._M_elems[0xb] = 0;
  enterTest.m_backend.data._M_elems[0xc] = 0;
  enterTest.m_backend.data._M_elems[0xd] = 0;
  enterTest.m_backend.data._M_elems[0xe] = 0;
  enterTest.m_backend.data._M_elems[0xf] = 0;
  enterTest.m_backend.data._M_elems[0x10] = 0;
  enterTest.m_backend.data._M_elems[0x11] = 0;
  enterTest.m_backend.data._M_elems[0x12] = 0;
  enterTest.m_backend.data._M_elems[0x13] = 0;
  enterTest.m_backend.data._M_elems[0x14] = 0;
  enterTest.m_backend.data._M_elems[0x15] = 0;
  enterTest.m_backend.data._M_elems[0x16] = 0;
  enterTest.m_backend.data._M_elems[0x17] = 0;
  enterTest.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterTest.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 0x1c;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems[6] = 0;
  enterUB.m_backend.data._M_elems[7] = 0;
  enterUB.m_backend.data._M_elems[8] = 0;
  enterUB.m_backend.data._M_elems[9] = 0;
  enterUB.m_backend.data._M_elems[10] = 0;
  enterUB.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.data._M_elems[0xc] = 0;
  enterUB.m_backend.data._M_elems[0xd] = 0;
  enterUB.m_backend.data._M_elems[0xe] = 0;
  enterUB.m_backend.data._M_elems[0xf] = 0;
  enterUB.m_backend.data._M_elems[0x10] = 0;
  enterUB.m_backend.data._M_elems[0x11] = 0;
  enterUB.m_backend.data._M_elems[0x12] = 0;
  enterUB.m_backend.data._M_elems[0x13] = 0;
  enterUB.m_backend.data._M_elems[0x14] = 0;
  enterUB.m_backend.data._M_elems[0x15] = 0;
  enterUB.m_backend.data._M_elems[0x16] = 0;
  enterUB.m_backend.data._M_elems[0x17] = 0;
  enterUB.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterUB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 0x1c;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems[6] = 0;
  enterLB.m_backend.data._M_elems[7] = 0;
  enterLB.m_backend.data._M_elems[8] = 0;
  enterLB.m_backend.data._M_elems[9] = 0;
  enterLB.m_backend.data._M_elems[10] = 0;
  enterLB.m_backend.data._M_elems[0xb] = 0;
  enterLB.m_backend.data._M_elems[0xc] = 0;
  enterLB.m_backend.data._M_elems[0xd] = 0;
  enterLB.m_backend.data._M_elems[0xe] = 0;
  enterLB.m_backend.data._M_elems[0xf] = 0;
  enterLB.m_backend.data._M_elems[0x10] = 0;
  enterLB.m_backend.data._M_elems[0x11] = 0;
  enterLB.m_backend.data._M_elems[0x12] = 0;
  enterLB.m_backend.data._M_elems[0x13] = 0;
  enterLB.m_backend.data._M_elems[0x14] = 0;
  enterLB.m_backend.data._M_elems[0x15] = 0;
  enterLB.m_backend.data._M_elems[0x16] = 0;
  enterLB.m_backend.data._M_elems[0x17] = 0;
  enterLB.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterLB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 0x1c;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems[6] = 0;
  enterVal.m_backend.data._M_elems[7] = 0;
  enterVal.m_backend.data._M_elems[8] = 0;
  enterVal.m_backend.data._M_elems[9] = 0;
  enterVal.m_backend.data._M_elems[10] = 0;
  enterVal.m_backend.data._M_elems[0xb] = 0;
  enterVal.m_backend.data._M_elems[0xc] = 0;
  enterVal.m_backend.data._M_elems[0xd] = 0;
  enterVal.m_backend.data._M_elems[0xe] = 0;
  enterVal.m_backend.data._M_elems[0xf] = 0;
  enterVal.m_backend.data._M_elems[0x10] = 0;
  enterVal.m_backend.data._M_elems[0x11] = 0;
  enterVal.m_backend.data._M_elems[0x12] = 0;
  enterVal.m_backend.data._M_elems[0x13] = 0;
  enterVal.m_backend.data._M_elems[0x14] = 0;
  enterVal.m_backend.data._M_elems[0x15] = 0;
  enterVal.m_backend.data._M_elems[0x16] = 0;
  enterVal.m_backend.data._M_elems[0x17] = 0;
  enterVal.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterVal.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 0x1c;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems[8] = 0;
  enterMax.m_backend.data._M_elems[9] = 0;
  enterMax.m_backend.data._M_elems[10] = 0;
  enterMax.m_backend.data._M_elems[0xb] = 0;
  enterMax.m_backend.data._M_elems[0xc] = 0;
  enterMax.m_backend.data._M_elems[0xd] = 0;
  enterMax.m_backend.data._M_elems[0xe] = 0;
  enterMax.m_backend.data._M_elems[0xf] = 0;
  enterMax.m_backend.data._M_elems[0x10] = 0;
  enterMax.m_backend.data._M_elems[0x11] = 0;
  enterMax.m_backend.data._M_elems[0x12] = 0;
  enterMax.m_backend.data._M_elems[0x13] = 0;
  enterMax.m_backend.data._M_elems[0x14] = 0;
  enterMax.m_backend.data._M_elems[0x15] = 0;
  enterMax.m_backend.data._M_elems[0x16] = 0;
  enterMax.m_backend.data._M_elems[0x17] = 0;
  enterMax.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_b40._0_4_ = cpp_dec_float_finite;
  local_b40._4_4_ = 0x1c;
  local_bb8._0_16_ = (undefined1  [16])0x0;
  local_bb8._16_16_ = (undefined1  [16])0x0;
  local_b98 = (undefined1  [16])0x0;
  local_b88 = (undefined1  [16])0x0;
  local_b78 = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = SUB1613((undefined1  [16])0x0,0);
  uStack_b4b = 0;
  iStack_b48 = 0;
  bStack_b44 = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 0x1c;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems[6] = 0;
  enterRO.m_backend.data._M_elems[7] = 0;
  enterRO.m_backend.data._M_elems[8] = 0;
  enterRO.m_backend.data._M_elems[9] = 0;
  enterRO.m_backend.data._M_elems[10] = 0;
  enterRO.m_backend.data._M_elems[0xb] = 0;
  enterRO.m_backend.data._M_elems[0xc] = 0;
  enterRO.m_backend.data._M_elems[0xd] = 0;
  enterRO.m_backend.data._M_elems[0xe] = 0;
  enterRO.m_backend.data._M_elems[0xf] = 0;
  enterRO.m_backend.data._M_elems[0x10] = 0;
  enterRO.m_backend.data._M_elems[0x11] = 0;
  enterRO.m_backend.data._M_elems[0x12] = 0;
  enterRO.m_backend.data._M_elems[0x13] = 0;
  enterRO.m_backend.data._M_elems[0x14] = 0;
  enterRO.m_backend.data._M_elems[0x15] = 0;
  enterRO.m_backend.data._M_elems[0x16] = 0;
  enterRO.m_backend.data._M_elems[0x17] = 0;
  enterRO.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterRO.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  local_a40._0_4_ = cpp_dec_float_finite;
  local_a40._4_4_ = 0x1c;
  local_ab8 = (undefined1  [16])0x0;
  local_aa8 = (undefined1  [16])0x0;
  local_a98 = (undefined1  [16])0x0;
  local_a88 = (undefined1  [16])0x0;
  local_a78 = (undefined1  [16])0x0;
  local_a68 = (undefined1  [16])0x0;
  local_a58 = SUB1613((undefined1  [16])0x0,0);
  uStack_a4b = 0;
  iStack_a48 = 0;
  uStack_a44 = 0;
  iVar20 = (*(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._vptr_ClassArray[0x7e])();
  pSVar27 = local_f08;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar20);
  local_f18 = CONCAT71(local_f18._1_7_,this->instableEnter);
  uVar21 = (uint)local_f08;
  local_f28 = this;
  local_f20 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,local_bb8,
             &enterStat,&enterRO,local_ab8);
  pSVar33 = local_f28;
  if (uVar21 == 0) {
    RVar47 = Tolerances::epsilon((local_f28->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_1,RVar47);
    pcVar37 = (cpp_dec_float<200u,int,void> *)&result_1;
    pnVar35 = &result;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = *(uint *)pcVar37;
      pcVar37 = pcVar37 + (ulong)bVar46 * -8 + 4;
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    result.m_backend.exp = result_1.m_backend.exp;
    result.m_backend.neg = result_1.m_backend.neg;
    result.m_backend.fpclass = result_1.m_backend.fpclass;
    result.m_backend.prec_elem = result_1.m_backend.prec_elem;
    if (result.m_backend.data._M_elems[0] != 0 || result_1.m_backend.fpclass != cpp_dec_float_finite
       ) {
      result.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (enterTest.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&enterTest.m_backend,&result.m_backend), 0 < iVar20)) {
      DVar8 = *local_f20;
      pnVar35 = &enterTest;
      puVar38 = local_b0;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        *puVar38 = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
        puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
      }
      local_40 = enterTest.m_backend.exp;
      local_3c = enterTest.m_backend.neg;
      local_38 = enterTest.m_backend.fpclass;
      iStack_34 = enterTest.m_backend.prec_elem;
      (*(pSVar33->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar33,DVar8,local_b0,(ulong)(uint)enterStat);
      pp_Var23 = (pSVar33->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      bVar45 = false;
      goto LAB_0050ad19;
    }
  }
  pUVar31 = pSVar33->theFvec;
  if (((pUVar31->thedelta).setupStatus == true) && ((pUVar31->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(&pSVar33->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&pUVar31->thedelta,rhs);
  }
  cVar43 = (char)pSVar27;
  if ((cVar43 == '\0') && (pSVar33->m_maxCycle < pSVar33->m_numCycle)) {
    pnVar35 = &enterMax;
    pnVar41 = &result_1;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    result_1.m_backend.exp = enterMax.m_backend.exp;
    result_1.m_backend.neg = enterMax.m_backend.neg;
    result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if ((result_1.m_backend.data._M_elems[0] == 0 &&
         enterMax.m_backend.fpclass == cpp_dec_float_finite) ||
       (result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1),
       enterMax.m_backend.fpclass != cpp_dec_float_NaN)) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,0,(type *)0x0);
      iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result_1.m_backend,&result.m_backend);
      lVar25 = 0x450;
      if (iVar20 < 1) goto LAB_0050a305;
    }
    else {
LAB_0050a305:
      lVar25 = 0x448;
    }
    (**(code **)((long)(pSVar33->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar25))(pSVar33);
  }
  pnVar35 = &enterMax;
  pnVar41 = &result_1;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  result_1.m_backend.exp = enterMax.m_backend.exp;
  result_1.m_backend.neg = enterMax.m_backend.neg;
  result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
  result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
  if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0
     ) {
    result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
  }
  pSVar33->boundflips = 0;
  pSVar2 = pSVar33->theratiotester;
  pnVar35 = &enterTest;
  puVar38 = local_130;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    *puVar38 = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
  }
  local_c0 = enterTest.m_backend.exp;
  local_bc = enterTest.m_backend.neg;
  local_b8 = enterTest.m_backend.fpclass;
  iStack_b4 = enterTest.m_backend.prec_elem;
  uVar21 = (*pSVar2->_vptr_SPxRatioTester[7])(pSVar2,&result_1,local_130,(ulong)(uVar21 & 0xff));
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(pSVar33->instableEnterVal).m_backend,0);
  (pSVar33->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
  pSVar33->instableEnter = false;
  bVar45 = -1 < (int)uVar21;
  local_f0c = uVar21;
  if (!bVar45) {
    pnVar35 = &result_1;
    pnVar41 = &local_7b8;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_7b8.m_backend.exp = result_1.m_backend.exp;
    local_7b8.m_backend.neg = result_1.m_backend.neg;
    local_7b8.m_backend.fpclass = result_1.m_backend.fpclass;
    local_7b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
    pnVar35 = &enterMax;
    pnVar41 = &result_16;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    result_16.m_backend.exp = enterMax.m_backend.exp;
    result_16.m_backend.neg = enterMax.m_backend.neg;
    result_16.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_16.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_16.m_backend.data._M_elems[0] != 0) {
      result_16.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    RVar47 = Tolerances::epsilon((pSVar33->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar19 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_7b8,&result_16,RVar47);
    if (!bVar19) {
      if (cVar43 == '\0') {
        ::soplex::infinity::__tls_init();
        a = *(double *)(in_FS_OFFSET + -8);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result,a);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_1.m_backend,&result.m_backend), iVar20 < 0)) {
          ::soplex::infinity::__tls_init();
          leavebound.m_backend.fpclass = cpp_dec_float_finite;
          leavebound.m_backend.prec_elem = 0x1c;
          leavebound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems[0x18] = 0;
          leavebound.m_backend.data._M_elems[0x19] = 0;
          leavebound.m_backend.data._M_elems._104_5_ = 0;
          leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          leavebound.m_backend.exp = 0;
          leavebound.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&leavebound,
                     (double)((ulong)a ^ (ulong)DAT_005f4010));
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_1.m_backend,&leavebound.m_backend), pDVar17 = local_f20,
             0 < iVar20)) {
            (**(pSVar33->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&pSVar33->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffff,local_f20,rhs,0);
            pUVar31 = pSVar33->theFvec;
            pnVar35 = &result_1;
            pnVar41 = &pUVar31->theval;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
              pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar41 + (ulong)bVar46 * -8 + 4);
            }
            (pUVar31->theval).m_backend.exp = result_1.m_backend.exp;
            (pUVar31->theval).m_backend.neg = result_1.m_backend.neg;
            (pUVar31->theval).m_backend.fpclass = result_1.m_backend.fpclass;
            (pUVar31->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
            pUVar31 = pSVar33->theFvec;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar31,&pUVar31->theval,&pUVar31->thedelta);
            DVar8 = *pDVar17;
            pnVar35 = &result_1;
            puVar38 = local_4b0;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              *puVar38 = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
              puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
            }
            local_440 = result_1.m_backend.exp;
            local_43c = result_1.m_backend.neg;
            local_438 = result_1.m_backend.fpclass;
            iStack_434 = result_1.m_backend.prec_elem;
            (*(pSVar33->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])(pSVar33,DVar8,(ulong)(uint)enterStat,local_4b0,rhs,local_ab8)
            ;
            puVar38 = (uint *)local_ab8;
            pnVar35 = &local_530;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pnVar35->m_backend).data._M_elems[0] = *puVar38;
              puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
            }
            local_530.m_backend.exp = iStack_a48;
            local_530.m_backend.neg = (bool)uStack_a44;
            local_530.m_backend.fpclass = (fpclass_type)local_a40;
            local_530.m_backend.prec_elem = local_a40._4_4_;
            updateNonbasicValue(pSVar33,&local_530);
            return bVar45;
          }
        }
      }
      DVar8 = *local_f20;
      pnVar35 = &enterTest;
      puVar38 = local_5b0;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        *puVar38 = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
        puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
      }
      local_540 = enterTest.m_backend.exp;
      local_53c = enterTest.m_backend.neg;
      local_538 = enterTest.m_backend.fpclass;
      iStack_534 = enterTest.m_backend.prec_elem;
      (*(pSVar33->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar33,DVar8,local_5b0,(ulong)(uint)enterStat);
      (**(pSVar33->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&pSVar33->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
      if (cVar43 != '\0') {
        return bVar45;
      }
      if (1 < (pSVar33->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar22 = pSVar33->spxout;
        if ((pSVar22 != (SPxOut *)0x0) && (4 < (int)pSVar22->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar22->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar22->_vptr_SPxOut[2])();
          pSVar22 = soplex::operator<<(pSVar33->spxout,"IENTER01 factorization triggered in ");
          pSVar22 = soplex::operator<<(pSVar22,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar22->m_streams[pSVar22->m_verbosity]);
          (*pSVar33->spxout->_vptr_SPxOut[2])(pSVar33->spxout,&result);
        }
        (*(pSVar33->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(pSVar33);
        return bVar45;
      }
      pnVar35 = &enterTest;
      pnVar41 = &result;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      result.m_backend.exp = enterTest.m_backend.exp;
      result.m_backend.neg = enterTest.m_backend.neg;
      result.m_backend.fpclass = enterTest.m_backend.fpclass;
      result.m_backend.prec_elem = enterTest.m_backend.prec_elem;
      fVar28 = enterTest.m_backend.fpclass;
      if ((enterTest.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] != 0 || fVar28 != cpp_dec_float_finite)) {
        result.m_backend.neg = false;
      }
      entertol(&leavebound,pSVar33);
      if (((fVar28 != cpp_dec_float_NaN) && (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&result.m_backend,&leavebound.m_backend), iVar20 < 0)) {
        pSVar22 = pSVar33->spxout;
        if ((pSVar22 != (SPxOut *)0x0) && (4 < (int)pSVar22->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar22->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar22->_vptr_SPxOut[2])();
          pSVar22 = soplex::operator<<(pSVar33->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar22->m_streams[pSVar22->m_verbosity]);
          (*pSVar33->spxout->_vptr_SPxOut[2])(pSVar33->spxout,&result);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&pSVar33->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&pSVar33->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,pSVar33->theCoPrhs);
        computePvec(pSVar33);
        computeCoTest(pSVar33);
        computeTest(pSVar33);
        return bVar45;
      }
      pSVar22 = pSVar33->spxout;
      if ((pSVar22 != (SPxOut *)0x0) && (4 < (int)pSVar22->m_verbosity)) {
        result.m_backend.data._M_elems[0] = pSVar22->m_verbosity;
        leavebound.m_backend.data._M_elems[0] = 5;
        (*pSVar22->_vptr_SPxOut[2])();
        pSVar22 = soplex::operator<<(pSVar33->spxout,
                                     "IENTER02 unboundedness/infeasibility found in ");
        pSVar22 = soplex::operator<<(pSVar22,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar22->m_streams[pSVar22->m_verbosity]);
        (*pSVar33->spxout->_vptr_SPxOut[2])(pSVar33->spxout,&result);
      }
      if (pSVar33->theRep == ROW) {
        pnVar35 = &result_1;
        pnVar41 = &local_630;
        for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
          (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
          pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
          pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_630.m_backend.exp = result_1.m_backend.exp;
        local_630.m_backend.neg = result_1.m_backend.neg;
        local_630.m_backend.fpclass = result_1.m_backend.fpclass;
        local_630.m_backend.prec_elem = result_1.m_backend.prec_elem;
        computeDualfarkas4Row(pSVar33,&local_630,(SPxId)*local_f20);
        if (pSVar33->m_status == OPTIMAL) {
          pSVar33->m_status = UNKNOWN;
        }
        if ((pSVar33->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus == INFEASIBLE) {
          return bVar45;
        }
        (pSVar33->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = INFEASIBLE;
        return bVar45;
      }
      pnVar35 = &result_1;
      pnVar41 = &local_6b0;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar41 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      local_6b0.m_backend.exp = result_1.m_backend.exp;
      local_6b0.m_backend.neg = result_1.m_backend.neg;
      local_6b0.m_backend.fpclass = result_1.m_backend.fpclass;
      local_6b0.m_backend.prec_elem = result_1.m_backend.prec_elem;
      computePrimalray4Col(pSVar33,&local_6b0,(SPxId)*local_f20);
      if (pSVar33->m_status == OPTIMAL) {
        pSVar33->m_status = UNKNOWN;
      }
      if ((pSVar33->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == UNBOUNDED) {
        return bVar45;
      }
      (pSVar33->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = UNBOUNDED;
      return bVar45;
    }
    DVar8 = *local_f20;
    if ((char)local_f18 == '\0') {
      (pSVar33->instableEnterId).super_DataKey = DVar8;
      pcVar36 = &enterTest.m_backend;
      pnVar35 = &pSVar33->instableEnterVal;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pnVar35->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + (ulong)bVar46 * -8 + 4);
      }
      (pSVar33->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (pSVar33->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (pSVar33->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (pSVar33->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar8 = *local_f20;
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 0x1c;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems[6] = 0;
      result_17.m_backend.data._M_elems[7] = 0;
      result_17.m_backend.data._M_elems[8] = 0;
      result_17.m_backend.data._M_elems[9] = 0;
      result_17.m_backend.data._M_elems[10] = 0;
      result_17.m_backend.data._M_elems[0xb] = 0;
      result_17.m_backend.data._M_elems[0xc] = 0;
      result_17.m_backend.data._M_elems[0xd] = 0;
      result_17.m_backend.data._M_elems[0xe] = 0;
      result_17.m_backend.data._M_elems[0xf] = 0;
      result_17.m_backend.data._M_elems[0x10] = 0;
      result_17.m_backend.data._M_elems[0x11] = 0;
      result_17.m_backend.data._M_elems[0x12] = 0;
      result_17.m_backend.data._M_elems[0x13] = 0;
      result_17.m_backend.data._M_elems[0x14] = 0;
      result_17.m_backend.data._M_elems[0x15] = 0;
      result_17.m_backend.data._M_elems[0x16] = 0;
      result_17.m_backend.data._M_elems[0x17] = 0;
      result_17.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result_17.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_17.m_backend.exp = 0;
      result_17.m_backend.neg = false;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_17.m_backend,&enterTest.m_backend,&result.m_backend);
      (*(pSVar33->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar33,DVar8,&result_17.m_backend,(ulong)(uint)enterStat);
    }
    else {
      pnVar35 = &enterTest;
      puVar38 = local_430;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        *puVar38 = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
        puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
      }
      local_3c0 = enterTest.m_backend.exp;
      local_3bc = enterTest.m_backend.neg;
      local_3b8 = enterTest.m_backend.fpclass;
      iStack_3b4 = enterTest.m_backend.prec_elem;
      (*(pSVar33->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar33,DVar8,local_430,(ulong)(uint)enterStat);
    }
    pp_Var23 = (pSVar33->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
LAB_0050ad19:
    (**pp_Var23)(&pSVar33->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
    return bVar45;
  }
  pnVar35 = &result_1;
  pcVar36 = &result.m_backend;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pcVar36->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  result.m_backend.exp = result_1.m_backend.exp;
  result.m_backend.neg = result_1.m_backend.neg;
  result.m_backend.fpclass = result_1.m_backend.fpclass;
  result.m_backend.prec_elem = result_1.m_backend.prec_elem;
  if ((result_1.m_backend.neg == true) &&
     (result_1.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
  {
    result.m_backend.neg = false;
  }
  entertol(&leavebound,pSVar33);
  local_f18 = (ulong)local_f0c;
  if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
      (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result.m_backend,&leavebound.m_backend), -1 < iVar20)) {
    pSVar33->m_numCycle = pSVar33->m_numCycle / 2;
  }
  else {
    pnVar7 = (pSVar33->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar34 = pnVar7 + local_f18;
    pnVar35 = &local_1b0;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = pnVar7[local_f18].m_backend.exp;
    local_1b0.m_backend.neg = pnVar7[local_f18].m_backend.neg;
    local_1b0.m_backend.fpclass = pnVar7[local_f18].m_backend.fpclass;
    local_1b0.m_backend.prec_elem = pnVar7[local_f18].m_backend.prec_elem;
    pnVar7 = (pSVar33->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar34 = pnVar7 + local_f18;
    pnVar35 = &local_230;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = pnVar7[local_f18].m_backend.exp;
    local_230.m_backend.neg = pnVar7[local_f18].m_backend.neg;
    local_230.m_backend.fpclass = pnVar7[local_f18].m_backend.fpclass;
    local_230.m_backend.prec_elem = pnVar7[local_f18].m_backend.prec_elem;
    RVar47 = Tolerances::epsilon((pSVar33->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar19 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_1b0,&local_230,RVar47);
    if (((bVar19) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
      pSVar33->m_numCycle = pSVar33->m_numCycle + 1;
      pSVar33->enterCycles = pSVar33->enterCycles + 1;
    }
  }
  pSVar27 = pSVar33->coSolveVector2;
  pSVar42 = pSVar33->coSolveVector3;
  if (pSVar42 ==
      (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    if (pSVar27 ==
        (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&pSVar33->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&pSVar33->theCoPvec->thedelta,
                &(pSVar33->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_f18].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    }
    else {
      pUVar31 = pSVar33->theCoPvec;
      pSVar42 = pSVar33->coSolveVector2rhs;
      pUVar32 = (pSVar33->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_f18;
      if ((pSVar33->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar33->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar5 = (pSVar33->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar5->_vptr_SLinSolver[0x18])(pSVar5,&pUVar31->thedelta,pSVar27,pUVar32,pSVar42);
    }
  }
  else {
    pSVar44 = &pSVar33->theCoPvec->thedelta;
    pUVar32 = (pSVar33->unitVecs).data.
              super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_f18;
    if (pSVar27 ==
        (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      pSVar27 = pSVar33->coSolveVector3rhs;
      if ((pSVar33->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar33->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar5 = (pSVar33->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar5->_vptr_SLinSolver[0x18])(pSVar5,pSVar44,pSVar42,pUVar32,pSVar27);
      pSVar27 = pSVar33->coSolveVector3;
      pUVar31 = pSVar33->theCoPvec;
      if (pSVar27->setupStatus == true) {
        lVar25 = (long)(pSVar27->super_IdxSet).num;
        if (0 < lVar25) {
          uVar29 = lVar25 + 1;
          do {
            piVar6 = (pSVar27->super_IdxSet).idx;
            pnVar7 = (pSVar27->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar20 = piVar6[uVar29 - 2];
            pnVar34 = pnVar7 + iVar20;
            pcVar36 = &result.m_backend;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar36->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
            }
            result.m_backend.exp = pnVar7[iVar20].m_backend.exp;
            result.m_backend.neg = pnVar7[iVar20].m_backend.neg;
            result.m_backend.fpclass = pnVar7[iVar20].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar7[iVar20].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pUVar31->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar6[uVar29 - 2]].m_backend,
                       &result.m_backend);
            uVar29 = uVar29 - 1;
          } while (1 < uVar29);
        }
      }
      else {
        uVar21 = (uint)((ulong)((long)(pUVar31->
                                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar31->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar21) {
          uVar30 = (ulong)(uVar21 & 0x7fffffff);
          uVar29 = uVar30 + 1;
          lVar25 = uVar30 * 0x80;
          do {
            pnVar7 = (pSVar27->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar38 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar25);
            pcVar36 = &result.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar36->data)._M_elems[0] = *puVar38;
              puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
            }
            result.m_backend.exp = *(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25);
            result.m_backend.neg = *(bool *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25 + 4U);
            result.m_backend._120_8_ =
                 *(undefined8 *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pUVar31->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar25),&result.m_backend);
            uVar29 = uVar29 - 1;
            lVar25 = lVar25 + -0x80;
          } while (1 < uVar29);
        }
      }
    }
    else {
      pSVar3 = pSVar33->coSolveVector2rhs;
      pSVar4 = pSVar33->coSolveVector3rhs;
      if ((pSVar33->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        local_f08 = pSVar27;
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar33->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        pSVar27 = local_f08;
      }
      pSVar5 = (pSVar33->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar5->_vptr_SLinSolver[0x1a])(pSVar5,pSVar44,pSVar27,pSVar42,pUVar32,pSVar3,pSVar4);
      pSVar27 = pSVar33->coSolveVector3;
      pUVar31 = pSVar33->theCoPvec;
      if (pSVar27->setupStatus == true) {
        lVar25 = (long)(pSVar27->super_IdxSet).num;
        if (0 < lVar25) {
          uVar29 = lVar25 + 1;
          do {
            piVar6 = (pSVar27->super_IdxSet).idx;
            pnVar7 = (pSVar27->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar20 = piVar6[uVar29 - 2];
            pnVar34 = pnVar7 + iVar20;
            pcVar36 = &result.m_backend;
            for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
              (pcVar36->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
            }
            result.m_backend.exp = pnVar7[iVar20].m_backend.exp;
            result.m_backend.neg = pnVar7[iVar20].m_backend.neg;
            result.m_backend.fpclass = pnVar7[iVar20].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar7[iVar20].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pUVar31->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar6[uVar29 - 2]].m_backend,
                       &result.m_backend);
            uVar29 = uVar29 - 1;
          } while (1 < uVar29);
        }
      }
      else {
        uVar21 = (uint)((ulong)((long)(pUVar31->
                                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar31->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar21) {
          uVar30 = (ulong)(uVar21 & 0x7fffffff);
          uVar29 = uVar30 + 1;
          lVar25 = uVar30 * 0x80;
          do {
            pnVar7 = (pSVar27->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar38 = (uint *)((long)pnVar7[-1].m_backend.data._M_elems + lVar25);
            pcVar36 = &result.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar36->data)._M_elems[0] = *puVar38;
              puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
              pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
            }
            result.m_backend.exp = *(int *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25);
            result.m_backend.neg = *(bool *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25 + 4U);
            result.m_backend._120_8_ =
                 *(undefined8 *)((long)(&pnVar7[-1].m_backend.data + 1) + lVar25 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pUVar31->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar25),&result.m_backend);
            uVar29 = uVar29 - 1;
            lVar25 = lVar25 + -0x80;
          } while (1 < uVar29);
        }
      }
    }
  }
  pSVar33 = local_f28;
  if (0 < local_f28->boundflips) {
    uVar21 = (uint)((ulong)((long)(local_f28->coSolveVector3->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_f28->coSolveVector3->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 7);
    if (0 < (int)uVar21) {
      pSVar27 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(ulong)(uVar21 & 0x7fffffff);
      do {
        pSVar42 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)&pSVar27[-1]._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7);
        pnVar7 = (pSVar33->coSolveVector3->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar20 = pnVar7[(long)pSVar42].m_backend.exp;
        bVar19 = pnVar7[(long)pSVar42].m_backend.neg;
        uVar9._0_4_ = pnVar7[(long)pSVar42].m_backend.fpclass;
        uVar9._4_4_ = pnVar7[(long)pSVar42].m_backend.prec_elem;
        local_f08 = pSVar27;
        memmove(&result.m_backend,pnVar7 + (long)pSVar42,0x70);
        pSVar33 = local_f28;
        result.m_backend.neg = bVar19;
        if ((bVar19 == true) &&
           ((fpclass_type)uVar9 != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
        {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar20;
        result.m_backend._120_8_ = uVar9;
        RVar47 = Tolerances::epsilon((local_f28->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        leavebound.m_backend.fpclass = cpp_dec_float_finite;
        leavebound.m_backend.prec_elem = 0x1c;
        leavebound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems[0x18] = 0;
        leavebound.m_backend.data._M_elems[0x19] = 0;
        leavebound.m_backend.data._M_elems._104_5_ = 0;
        leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        leavebound.m_backend.exp = 0;
        leavebound.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&leavebound,RVar47);
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result.m_backend,&leavebound.m_backend), 0 < iVar20)) {
          pUVar31 = pSVar33->thePvec;
          pnVar7 = (pSVar33->coSolveVector3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar20 = pnVar7[(long)pSVar42].m_backend.exp;
          bVar19 = pnVar7[(long)pSVar42].m_backend.neg;
          fVar1 = pnVar7[(long)pSVar42].m_backend.fpclass;
          iVar14 = pnVar7[(long)pSVar42].m_backend.prec_elem;
          memmove(&leavebound,pnVar7 + (long)pSVar42,0x70);
          leavebound.m_backend.exp = iVar20;
          leavebound.m_backend.neg = bVar19;
          leavebound.m_backend.fpclass = fVar1;
          leavebound.m_backend.prec_elem = iVar14;
          if (fVar1 != cpp_dec_float_finite || leavebound.m_backend.data._M_elems[0] != 0) {
            leavebound.m_backend.neg = (bool)(bVar19 ^ 1);
          }
          pIVar10 = (local_f28->thecovectors->set).theitem;
          iVar20 = (local_f28->thecovectors->set).thekey[(long)pSVar42].idx;
          lVar25 = (long)pIVar10[iVar20].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          pSVar33 = local_f28;
          if (0 < lVar25) {
            pIVar10 = pIVar10 + iVar20;
            uVar29 = lVar25 + 1;
            lVar25 = lVar25 * 0x84;
            do {
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pIVar10->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem[-1].val.m_backend.data._M_elems + lVar25);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              pcVar36 = &leavebound.m_backend;
              if (pcVar24 != &result.m_backend) {
                pcVar40 = &result.m_backend;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar40->data)._M_elems[0] =
                       (((cpp_dec_float<200U,_int,_void> *)&pcVar36->data)->data)._M_elems[0];
                  pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar36 + (ulong)bVar46 * -8 + 4);
                  pcVar40 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar40 + (ulong)bVar46 * -8 + 4);
                }
                result.m_backend.exp = leavebound.m_backend.exp;
                result.m_backend.neg = leavebound.m_backend.neg;
                result.m_backend.fpclass = leavebound.m_backend.fpclass;
                result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
                pcVar36 = pcVar24;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&result.m_backend,pcVar36);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&(pUVar31->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)(&(pIVar10->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem[-1].val + 1) + lVar25)].m_backend,
                         &result.m_backend);
              uVar29 = uVar29 - 1;
              pSVar33 = local_f28;
              lVar25 = lVar25 + -0x84;
            } while (1 < uVar29);
          }
        }
        pSVar27 = pSVar42;
      } while (1 < (long)local_f08);
    }
    if (local_f20->info < 1) {
      pUVar31 = pSVar33->thePvec;
      SPxRowId::SPxRowId((SPxRowId *)&result,(SPxId *)local_f20);
      pLVar15 = &(pSVar33->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    else {
      pUVar31 = pSVar33->theCoPvec;
      SPxColId::SPxColId((SPxColId *)&result,(SPxId *)local_f20);
      pLVar15 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(pSVar33->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    iVar20 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(pLVar15->
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).set,(DataKey *)&result);
    pnVar7 = (pUVar31->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar34 = pnVar7 + iVar20;
    puVar39 = (undefined4 *)local_bb8;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      *puVar39 = *(undefined4 *)&pnVar34->m_backend;
      pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_b48 = pnVar7[iVar20].m_backend.exp;
    bStack_b44 = pnVar7[iVar20].m_backend.neg;
    local_b40._0_4_ = pnVar7[iVar20].m_backend.fpclass;
    local_b40._4_4_ = pnVar7[iVar20].m_backend.prec_elem;
    pSVar33->totalboundflips = pSVar33->totalboundflips + pSVar33->boundflips;
  }
  uVar9 = enterRO.m_backend._120_8_;
  bVar19 = enterRO.m_backend.neg;
  iVar20 = enterRO.m_backend.exp;
  uVar29 = local_f18;
  pnVar7 = (pSVar33->theCoPrhs->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar35 = &enterRO;
  pnVar34 = pnVar7 + local_f18;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  pnVar7[local_f18].m_backend.exp = enterRO.m_backend.exp;
  pnVar7[local_f18].m_backend.neg = enterRO.m_backend.neg;
  pnVar7[local_f18].m_backend.fpclass = enterRO.m_backend.fpclass;
  pnVar7[local_f18].m_backend.prec_elem = enterRO.m_backend.prec_elem;
  pnVar35 = &enterRO;
  pcVar36 = &leavebound.m_backend;
  for (lVar25 = 0x1c; uVar18 = enterRO.m_backend._120_8_, lVar25 != 0; lVar25 = lVar25 + -1) {
    (pcVar36->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  leavebound.m_backend.exp = iVar20;
  leavebound.m_backend.neg = bVar19;
  enterRO.m_backend.fpclass = (fpclass_type)uVar9;
  enterRO.m_backend.prec_elem = SUB84(uVar9,4);
  leavebound.m_backend.fpclass = enterRO.m_backend.fpclass;
  leavebound.m_backend.prec_elem = enterRO.m_backend.prec_elem;
  enterRO.m_backend._120_8_ = uVar18;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&leavebound.m_backend,(cpp_dec_float<200U,_int,_void> *)local_bb8);
  pnVar7 = (pSVar33->theFvec->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar34 = pnVar7 + uVar29;
  pcVar36 = &result_11.m_backend;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pcVar36->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  result_11.m_backend.exp = pnVar7[uVar29].m_backend.exp;
  result_11.m_backend.neg = pnVar7[uVar29].m_backend.neg;
  result_11.m_backend.fpclass = pnVar7[uVar29].m_backend.fpclass;
  result_11.m_backend.prec_elem = pnVar7[uVar29].m_backend.prec_elem;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&leavebound.m_backend,&result_11.m_backend);
  pUVar31 = pSVar33->theCoPvec;
  pcVar36 = &result.m_backend;
  pnVar35 = &pUVar31->theval;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar35->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + (ulong)bVar46 * -8 + 4);
  }
  (pUVar31->theval).m_backend.exp = result.m_backend.exp;
  (pUVar31->theval).m_backend.neg = result.m_backend.neg;
  (pUVar31->theval).m_backend.fpclass = result.m_backend.fpclass;
  (pUVar31->theval).m_backend.prec_elem = result.m_backend.prec_elem;
  pUVar31 = pSVar33->theCoPvec;
  RVar47 = Tolerances::epsilon((pSVar33->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result,RVar47);
  if ((((pUVar31->theval).m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&(pUVar31->theval).m_backend,&result.m_backend), iVar20 < 1)) {
    pUVar31 = pSVar33->theCoPvec;
    RVar47 = Tolerances::epsilon((pSVar33->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 0x1c;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems[6] = 0;
    result_11.m_backend.data._M_elems[7] = 0;
    result_11.m_backend.data._M_elems[8] = 0;
    result_11.m_backend.data._M_elems[9] = 0;
    result_11.m_backend.data._M_elems[10] = 0;
    result_11.m_backend.data._M_elems[0xb] = 0;
    result_11.m_backend.data._M_elems[0xc] = 0;
    result_11.m_backend.data._M_elems[0xd] = 0;
    result_11.m_backend.data._M_elems[0xe] = 0;
    result_11.m_backend.data._M_elems[0xf] = 0;
    result_11.m_backend.data._M_elems[0x10] = 0;
    result_11.m_backend.data._M_elems[0x11] = 0;
    result_11.m_backend.data._M_elems[0x12] = 0;
    result_11.m_backend.data._M_elems[0x13] = 0;
    result_11.m_backend.data._M_elems[0x14] = 0;
    result_11.m_backend.data._M_elems[0x15] = 0;
    result_11.m_backend.data._M_elems[0x16] = 0;
    result_11.m_backend.data._M_elems[0x17] = 0;
    result_11.m_backend.data._M_elems[0x18] = 0;
    result_11.m_backend.data._M_elems[0x19] = 0;
    result_11.m_backend.data._M_elems._104_5_ = 0;
    result_11.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_11,RVar47);
    pcVar37 = (cpp_dec_float<200u,int,void> *)&result_11;
    pnVar35 = &leavebound;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = *(uint *)pcVar37;
      pcVar37 = pcVar37 + (ulong)bVar46 * -8 + 4;
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    leavebound.m_backend.exp = result_11.m_backend.exp;
    leavebound.m_backend.neg = result_11.m_backend.neg;
    leavebound.m_backend.fpclass = result_11.m_backend.fpclass;
    leavebound.m_backend.prec_elem = result_11.m_backend.prec_elem;
    if (leavebound.m_backend.data._M_elems[0] != 0 ||
        result_11.m_backend.fpclass != cpp_dec_float_finite) {
      leavebound.m_backend.neg = (bool)(result_11.m_backend.neg ^ 1);
    }
    if (((result_11.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((pUVar31->theval).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&(pUVar31->theval).m_backend,&leavebound.m_backend), iVar20 < 0))
    goto LAB_0050b3c9;
  }
  else {
LAB_0050b3c9:
    if (pSVar33->thePricing == FULL) {
      pUVar31 = pSVar33->theCoPvec;
      pUVar11 = pSVar33->thePvec;
      pnVar35 = &pUVar31->theval;
      pnVar41 = &pUVar11->theval;
      for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pnVar41->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
        pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar35 + (ulong)bVar46 * -8 + 4);
        pnVar41 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar41 + (ulong)bVar46 * -8 + 4);
      }
      (pUVar11->theval).m_backend.exp = (pUVar31->theval).m_backend.exp;
      (pUVar11->theval).m_backend.neg = (pUVar31->theval).m_backend.neg;
      iVar16 = (pUVar31->theval).m_backend.prec_elem;
      (pUVar11->theval).m_backend.fpclass = (pUVar31->theval).m_backend.fpclass;
      (pUVar11->theval).m_backend.prec_elem = iVar16;
      (*(pSVar33->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x86])(pSVar33);
    }
    (*(pSVar33->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x87])(pSVar33);
  }
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems[0xe] = 0;
  leavebound.m_backend.data._M_elems[0xf] = 0;
  leavebound.m_backend.data._M_elems[0x10] = 0;
  leavebound.m_backend.data._M_elems[0x11] = 0;
  leavebound.m_backend.data._M_elems[0x12] = 0;
  leavebound.m_backend.data._M_elems[0x13] = 0;
  leavebound.m_backend.data._M_elems[0x14] = 0;
  leavebound.m_backend.data._M_elems[0x15] = 0;
  leavebound.m_backend.data._M_elems[0x16] = 0;
  leavebound.m_backend.data._M_elems[0x17] = 0;
  leavebound.m_backend.data._M_elems[0x18] = 0;
  leavebound.m_backend.data._M_elems[0x19] = 0;
  leavebound.m_backend.data._M_elems._104_5_ = 0;
  leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  pnVar35 = &enterMax;
  puVar38 = local_2b0;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    *puVar38 = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
  }
  local_240 = enterMax.m_backend.exp;
  local_23c = enterMax.m_backend.neg;
  local_238 = enterMax.m_backend.fpclass;
  iStack_234 = enterMax.m_backend.prec_elem;
  (*(pSVar33->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x82])(pSVar33,(ulong)local_f0c,local_2b0,&leavebound,local_ab8);
  pnVar7 = (pSVar33->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar35 = &enterUB;
  pnVar34 = pnVar7 + uVar29;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  pnVar7[uVar29].m_backend.exp = enterUB.m_backend.exp;
  pnVar7[uVar29].m_backend.neg = enterUB.m_backend.neg;
  pnVar7[uVar29].m_backend.fpclass = enterUB.m_backend.fpclass;
  pnVar7[uVar29].m_backend.prec_elem = enterUB.m_backend.prec_elem;
  pnVar7 = (pSVar33->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar35 = &enterLB;
  pnVar34 = pnVar7 + uVar29;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  pnVar7[uVar29].m_backend.exp = enterLB.m_backend.exp;
  pnVar7[uVar29].m_backend.neg = enterLB.m_backend.neg;
  pnVar7[uVar29].m_backend.fpclass = enterLB.m_backend.fpclass;
  pnVar7[uVar29].m_backend.prec_elem = enterLB.m_backend.prec_elem;
  updateCoTest(pSVar33);
  if (pSVar33->thePricing == FULL) {
    updateTest(pSVar33);
  }
  pUVar31 = pSVar33->theFvec;
  pcVar36 = &result_1.m_backend;
  pnVar35 = &pUVar31->theval;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar35->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + (ulong)bVar46 * -8 + 4);
  }
  (pUVar31->theval).m_backend.exp = result_1.m_backend.exp;
  (pUVar31->theval).m_backend.neg = result_1.m_backend.neg;
  (pUVar31->theval).m_backend.fpclass = result_1.m_backend.fpclass;
  (pUVar31->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
  pUVar31 = pSVar33->theFvec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)pUVar31,&pUVar31->theval,&pUVar31->thedelta);
  pnVar35 = &enterVal;
  pcVar36 = &result.m_backend;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pcVar36->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  result.m_backend.exp = enterVal.m_backend.exp;
  result.m_backend.neg = enterVal.m_backend.neg;
  result.m_backend.fpclass = enterVal.m_backend.fpclass;
  result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result.m_backend,&result_1.m_backend);
  pnVar7 = (pSVar33->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar36 = &result.m_backend;
  pnVar34 = pnVar7 + uVar29;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(uint *)&pnVar34->m_backend = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    pnVar34 = (pointer)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  pnVar7[uVar29].m_backend.exp = result.m_backend.exp;
  pnVar7[uVar29].m_backend.neg = result.m_backend.neg;
  pnVar7[uVar29].m_backend.fpclass = result.m_backend.fpclass;
  pnVar7[uVar29].m_backend.prec_elem = result.m_backend.prec_elem;
  RVar47 = Tolerances::epsilon((pSVar33->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result.m_backend,RVar47);
  if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leavebound.m_backend,&result.m_backend), iVar20 < 1)) {
    RVar47 = Tolerances::epsilon((pSVar33->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_840._0_4_ = cpp_dec_float_finite;
    local_840._4_4_ = 0x1c;
    local_8b8 = 0;
    uStack_8b0 = 0;
    local_8a8 = 0;
    uStack_8a0 = 0;
    local_898 = 0;
    uStack_890 = 0;
    local_888 = 0;
    uStack_880 = 0;
    local_878 = 0;
    uStack_870 = 0;
    local_868 = 0;
    uStack_860 = 0;
    local_858 = 0;
    uStack_850 = 0;
    uStack_84b = 0;
    iStack_848 = 0;
    bStack_844 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_8b8,RVar47);
    pcVar37 = (cpp_dec_float<200u,int,void> *)&local_8b8;
    pnVar35 = &result_11;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = *(uint *)pcVar37;
      pcVar37 = pcVar37 + (ulong)bVar46 * -8 + 4;
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    result_11.m_backend.exp = iStack_848;
    result_11.m_backend.neg = (bool)bStack_844;
    result_11.m_backend.fpclass = (fpclass_type)local_840;
    result_11.m_backend.prec_elem = local_840._4_4_;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_840 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_844 ^ 1);
    }
    if ((((fpclass_type)local_840 != cpp_dec_float_NaN) &&
        (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&leavebound.m_backend,&result_11.m_backend), iVar20 < 0))
    goto LAB_0050b740;
  }
  else {
LAB_0050b740:
    pVVar12 = pSVar33->theFrhs;
    pnVar35 = &leavebound;
    pcVar36 = &result_11.m_backend;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar36->data)->data)._M_elems[0] =
           (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    }
    result_11.m_backend.exp = leavebound.m_backend.exp;
    result_11.m_backend.neg = leavebound.m_backend.neg;
    result_11.m_backend.fpclass = leavebound.m_backend.fpclass;
    result_11.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result_11.m_backend.data._M_elems[0] != 0) {
      result_11.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    pSVar13 = (pSVar33->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).matrix.data[local_f18];
    lVar25 = (long)pSVar13->memused;
    pSVar33 = local_f28;
    if (0 < lVar25) {
      uVar29 = lVar25 + 1;
      lVar25 = lVar25 * 0x84;
      do {
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)pSVar13->m_elem[-1].val.m_backend.data._M_elems + lVar25);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar36 = &result_11.m_backend;
        if (pcVar24 != &result.m_backend) {
          pcVar40 = &result.m_backend;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar40->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar36->data)->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
            pcVar40 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar40 + (ulong)bVar46 * -8 + 4);
          }
          result.m_backend.exp = result_11.m_backend.exp;
          result.m_backend.neg = result_11.m_backend.neg;
          result.m_backend.fpclass = result_11.m_backend.fpclass;
          result.m_backend.prec_elem = result_11.m_backend.prec_elem;
          pcVar36 = pcVar24;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result.m_backend,pcVar36);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(pVVar12->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pSVar13->m_elem[-1].val + 1) + lVar25)].m_backend,
                   &result.m_backend);
        uVar29 = uVar29 - 1;
        pSVar33 = local_f28;
        lVar25 = lVar25 + -0x84;
      } while (1 < uVar29);
    }
  }
  RVar47 = Tolerances::epsilon((pSVar33->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result.m_backend,RVar47);
  if (((enterVal.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&enterVal.m_backend,&result.m_backend), iVar20 < 1)) {
    RVar47 = Tolerances::epsilon((pSVar33->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_840._0_4_ = cpp_dec_float_finite;
    local_840._4_4_ = 0x1c;
    local_8b8 = 0;
    uStack_8b0 = 0;
    local_8a8 = 0;
    uStack_8a0 = 0;
    local_898 = 0;
    uStack_890 = 0;
    local_888 = 0;
    uStack_880 = 0;
    local_878 = 0;
    uStack_870 = 0;
    local_868 = 0;
    uStack_860 = 0;
    local_858 = 0;
    uStack_850 = 0;
    uStack_84b = 0;
    iStack_848 = 0;
    bStack_844 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_8b8,RVar47);
    pcVar37 = (cpp_dec_float<200u,int,void> *)&local_8b8;
    pnVar35 = &result_11;
    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = *(uint *)pcVar37;
      pcVar37 = pcVar37 + (ulong)bVar46 * -8 + 4;
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    result_11.m_backend.exp = iStack_848;
    result_11.m_backend.neg = (bool)bStack_844;
    result_11.m_backend.fpclass = (fpclass_type)local_840;
    result_11.m_backend.prec_elem = local_840._4_4_;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_840 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_844 ^ 1);
    }
    if ((((fpclass_type)local_840 == cpp_dec_float_NaN) ||
        (enterVal.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&enterVal.m_backend,&result_11.m_backend), -1 < iVar20))
    goto LAB_0050bb03;
  }
  lVar25 = (long)rhs->memused;
  if (0 < lVar25) {
    pVVar12 = pSVar33->theFrhs;
    uVar29 = lVar25 + 1;
    lVar25 = lVar25 * 0x84;
    do {
      pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                ((long)rhs->m_elem[-1].val.m_backend.data._M_elems + lVar25);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      pcVar36 = &enterVal.m_backend;
      if (pcVar24 != &result.m_backend) {
        pcVar40 = &result.m_backend;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar40->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar36->data)->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
          pcVar40 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar40 + (ulong)bVar46 * -8 + 4);
        }
        result.m_backend.exp = enterVal.m_backend.exp;
        result.m_backend.neg = enterVal.m_backend.neg;
        result.m_backend.fpclass = enterVal.m_backend.fpclass;
        result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
        pcVar36 = pcVar24;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,pcVar36);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(pVVar12->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&rhs->m_elem[-1].val + 1) + lVar25)].m_backend,&result.m_backend)
      ;
      uVar29 = uVar29 - 1;
      lVar25 = lVar25 + -0x84;
    } while (1 < uVar29);
  }
LAB_0050bb03:
  puVar38 = (uint *)local_ab8;
  pnVar35 = local_3b0;
  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
    (pnVar35->m_backend).data._M_elems[0] = *puVar38;
    puVar38 = puVar38 + (ulong)bVar46 * -2 + 1;
    pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar35 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_3b0[0].m_backend.exp = iStack_a48;
  local_3b0[0].m_backend.neg = (bool)uStack_a44;
  local_3b0[0].m_backend.fpclass = (fpclass_type)local_a40;
  local_3b0[0].m_backend.prec_elem = local_a40._4_4_;
  updateNonbasicValue(pSVar33,local_3b0);
  (**(pSVar33->
     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxBasisBase)
            (&pSVar33->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,(ulong)local_f0c,local_f20,rhs,&pSVar33->theFvec->thedelta);
  return bVar45;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}